

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O2

_Bool array_run_container_intersect(array_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  int iVar2;
  int32_t length;
  rle16_t *prVar3;
  long lVar4;
  _Bool _Var5;
  int pos;
  ushort uVar6;
  int iVar7;
  uint16_t min;
  long lVar8;
  bool bVar9;
  
  _Var5 = run_container_is_full(src_2);
  if (_Var5) {
    _Var5 = src_1->cardinality != 0;
  }
  else {
    iVar2 = src_2->n_runs;
    pos = 0;
    if (iVar2 != 0) {
      prVar3 = src_2->runs;
      min = prVar3->value;
      uVar6 = prVar3->length;
      length = src_1->cardinality;
      lVar8 = 0;
      for (; pos < length; pos = advanceUntil(src_1->array,pos,length,min)) {
        uVar1 = src_1->array[pos];
        iVar7 = (int)lVar8;
        lVar8 = (long)iVar7;
        iVar7 = (iVar2 + -1) - iVar7;
        while ((uint)uVar6 + (uint)min < (uint)uVar1) {
          bVar9 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          if (bVar9) goto LAB_00117890;
          min = prVar3[lVar8 + 1].value;
          lVar4 = lVar8 + 1;
          lVar8 = lVar8 + 1;
          uVar6 = prVar3[lVar4].length;
        }
        if (min <= uVar1) {
          return pos < length;
        }
      }
    }
LAB_00117890:
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool array_run_container_intersect(const array_container_t *src_1,
                                   const run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return !array_container_empty(src_1);
    }
    if (src_2->n_runs == 0) {
        return false;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return false;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            return true;
        }
    }
    return false;
}